

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_assoc.cpp
# Opt level: O0

Assoc * __thiscall
Omega_h::get_box_assoc_abi_cxx11_(Assoc *__return_storage_ptr__,Omega_h *this,int dim)

{
  initializer_list<Omega_h::ClassPair> __l;
  initializer_list<Omega_h::ClassPair> __l_00;
  initializer_list<Omega_h::ClassPair> __l_01;
  initializer_list<Omega_h::ClassPair> __l_02;
  initializer_list<Omega_h::ClassPair> __l_03;
  initializer_list<Omega_h::ClassPair> __l_04;
  initializer_list<Omega_h::ClassPair> __l_05;
  initializer_list<Omega_h::ClassPair> __l_06;
  initializer_list<Omega_h::ClassPair> __l_07;
  initializer_list<Omega_h::ClassPair> __l_08;
  initializer_list<Omega_h::ClassPair> __l_09;
  initializer_list<Omega_h::ClassPair> __l_10;
  initializer_list<Omega_h::ClassPair> __l_11;
  initializer_list<Omega_h::ClassPair> __l_12;
  initializer_list<Omega_h::ClassPair> __l_13;
  initializer_list<Omega_h::ClassPair> __l_14;
  initializer_list<Omega_h::ClassPair> __l_15;
  initializer_list<Omega_h::ClassPair> __l_16;
  initializer_list<Omega_h::ClassPair> __l_17;
  initializer_list<Omega_h::ClassPair> __l_18;
  initializer_list<Omega_h::ClassPair> __l_19;
  initializer_list<Omega_h::ClassPair> __l_20;
  initializer_list<Omega_h::ClassPair> __l_21;
  initializer_list<Omega_h::ClassPair> __l_22;
  initializer_list<Omega_h::ClassPair> __l_23;
  initializer_list<Omega_h::ClassPair> __l_24;
  initializer_list<Omega_h::ClassPair> __l_25;
  initializer_list<Omega_h::ClassPair> __l_26;
  initializer_list<Omega_h::ClassPair> __l_27;
  initializer_list<Omega_h::ClassPair> __l_28;
  reference pvVar1;
  mapped_type *pmVar2;
  allocator local_7a1;
  string local_7a0 [32];
  ClassPair local_780;
  iterator local_778;
  size_type local_770;
  allocator local_761;
  string local_760 [32];
  ClassPair local_740;
  iterator local_738;
  size_type local_730;
  allocator local_721;
  string local_720 [32];
  ClassPair local_700;
  iterator local_6f8;
  size_type local_6f0;
  allocator local_6e1;
  string local_6e0 [32];
  ClassPair local_6c0;
  iterator local_6b8;
  size_type local_6b0;
  allocator local_6a1;
  string local_6a0 [32];
  ClassPair local_680;
  iterator local_678;
  size_type local_670;
  allocator local_661;
  string local_660 [32];
  ClassPair local_640;
  iterator local_638;
  size_type local_630;
  allocator local_621;
  string local_620 [32];
  ClassPair local_600;
  iterator local_5f8;
  size_type local_5f0;
  allocator local_5e1;
  string local_5e0 [32];
  ClassPair local_5c0;
  iterator local_5b8;
  size_type local_5b0;
  allocator local_5a1;
  string local_5a0 [32];
  ClassPair local_580;
  iterator local_578;
  size_type local_570;
  allocator local_561;
  string local_560 [32];
  ClassPair local_540;
  iterator local_538;
  size_type local_530;
  allocator local_521;
  string local_520 [32];
  ClassPair local_500;
  iterator local_4f8;
  size_type local_4f0;
  allocator local_4e1;
  string local_4e0 [32];
  ClassPair local_4c0;
  iterator local_4b8;
  size_type local_4b0;
  allocator local_4a1;
  string local_4a0 [32];
  ClassPair local_480;
  iterator local_478;
  size_type local_470;
  allocator local_461;
  string local_460 [32];
  ClassPair local_440;
  iterator local_438;
  size_type local_430;
  allocator local_421;
  string local_420 [32];
  ClassPair local_400;
  iterator local_3f8;
  size_type local_3f0;
  allocator local_3e1;
  string local_3e0 [32];
  ClassPair local_3c0;
  iterator local_3b8;
  size_type local_3b0;
  allocator local_3a1;
  string local_3a0 [32];
  ClassPair local_380;
  iterator local_378;
  size_type local_370;
  allocator local_361;
  string local_360 [32];
  ClassPair local_340;
  iterator local_338;
  size_type local_330;
  allocator local_321;
  string local_320 [32];
  ClassPair local_300;
  iterator local_2f8;
  size_type local_2f0;
  allocator local_2e1;
  string local_2e0 [32];
  ClassPair local_2c0;
  iterator local_2b8;
  size_type local_2b0;
  allocator local_2a1;
  string local_2a0 [32];
  ClassPair local_280;
  iterator local_278;
  size_type local_270;
  allocator local_261;
  string local_260 [32];
  ClassPair local_240;
  iterator local_238;
  size_type local_230;
  allocator local_221;
  string local_220 [32];
  ClassPair local_200;
  iterator local_1f8;
  size_type local_1f0;
  allocator local_1e1;
  string local_1e0 [32];
  ClassPair local_1c0;
  iterator local_1b8;
  size_type local_1b0;
  allocator local_1a1;
  string local_1a0 [32];
  ClassPair local_180;
  iterator local_178;
  size_type local_170;
  allocator local_161;
  string local_160 [32];
  ClassPair local_140;
  iterator local_138;
  size_type local_130;
  allocator local_121;
  string local_120 [32];
  ClassPair local_100;
  iterator local_f8;
  size_type local_f0;
  allocator local_e1;
  string local_e0 [32];
  ClassPair local_c0;
  iterator local_b8;
  size_type local_b0;
  allocator local_a1;
  string local_a0 [32];
  ClassPair local_80;
  iterator local_78;
  size_type local_70;
  allocator local_61;
  string local_60 [48];
  ClassPair local_30;
  iterator local_28;
  size_type local_20;
  undefined1 local_15;
  int local_14;
  Assoc *pAStack_10;
  int dim_local;
  Assoc *assoc;
  
  local_14 = (int)this;
  local_15 = 0;
  pAStack_10 = __return_storage_ptr__;
  std::
  array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
  ::array(__return_storage_ptr__);
  if (local_14 == 1) {
    ClassPair::ClassPair(&local_30,0,0);
    local_28 = &local_30;
    local_20 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"x-",&local_61);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_60);
    __l_28._M_len = local_20;
    __l_28._M_array = local_28;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_28);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    ClassPair::ClassPair(&local_80,0,0);
    local_78 = &local_80;
    local_70 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"x-",&local_a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_a0);
    __l_27._M_len = local_70;
    __l_27._M_array = local_78;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_27);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    ClassPair::ClassPair(&local_c0,1,1);
    local_b8 = &local_c0;
    local_b0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"body",&local_e1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_e0);
    __l_26._M_len = local_b0;
    __l_26._M_array = local_b8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_26);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    ClassPair::ClassPair(&local_100,1,1);
    local_f8 = &local_100;
    local_f0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"body",&local_121);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_120);
    __l_25._M_len = local_f0;
    __l_25._M_array = local_f8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_25);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    ClassPair::ClassPair(&local_140,0,2);
    local_138 = &local_140;
    local_130 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"x+",&local_161);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_160);
    __l_24._M_len = local_130;
    __l_24._M_array = local_138;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_24);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    ClassPair::ClassPair(&local_180,0,2);
    local_178 = &local_180;
    local_170 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"x+",&local_1a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_1a0);
    __l_23._M_len = local_170;
    __l_23._M_array = local_178;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_23);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  }
  else if (local_14 == 2) {
    ClassPair::ClassPair(&local_1c0,1,1);
    local_1b8 = &local_1c0;
    local_1b0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,"y-",&local_1e1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_1e0);
    __l_22._M_len = local_1b0;
    __l_22._M_array = local_1b8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_22);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    ClassPair::ClassPair(&local_200,1,1);
    local_1f8 = &local_200;
    local_1f0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"y-",&local_221);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_220);
    __l_21._M_len = local_1f0;
    __l_21._M_array = local_1f8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_21);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    ClassPair::ClassPair(&local_240,1,3);
    local_238 = &local_240;
    local_230 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,"x-",&local_261);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_260);
    __l_20._M_len = local_230;
    __l_20._M_array = local_238;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_20);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    ClassPair::ClassPair(&local_280,1,3);
    local_278 = &local_280;
    local_270 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"x-",&local_2a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_2a0);
    __l_19._M_len = local_270;
    __l_19._M_array = local_278;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_19);
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    ClassPair::ClassPair(&local_2c0,2,4);
    local_2b8 = &local_2c0;
    local_2b0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e0,"body",&local_2e1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_2e0);
    __l_18._M_len = local_2b0;
    __l_18._M_array = local_2b8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_18);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    ClassPair::ClassPair(&local_300,2,4);
    local_2f8 = &local_300;
    local_2f0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_320,"body",&local_321);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_320);
    __l_17._M_len = local_2f0;
    __l_17._M_array = local_2f8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_17);
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    ClassPair::ClassPair(&local_340,1,5);
    local_338 = &local_340;
    local_330 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"x+",&local_361);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_360);
    __l_16._M_len = local_330;
    __l_16._M_array = local_338;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_16);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    ClassPair::ClassPair(&local_380,1,5);
    local_378 = &local_380;
    local_370 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a0,"x+",&local_3a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_3a0);
    __l_15._M_len = local_370;
    __l_15._M_array = local_378;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_15);
    std::__cxx11::string::~string(local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    ClassPair::ClassPair(&local_3c0,1,7);
    local_3b8 = &local_3c0;
    local_3b0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"y+",&local_3e1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_3e0);
    __l_14._M_len = local_3b0;
    __l_14._M_array = local_3b8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_14);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    ClassPair::ClassPair(&local_400,1,7);
    local_3f8 = &local_400;
    local_3f0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,"y+",&local_421);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_420);
    __l_13._M_len = local_3f0;
    __l_13._M_array = local_3f8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_13);
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
  }
  else if (local_14 == 3) {
    ClassPair::ClassPair(&local_440,2,4);
    local_438 = &local_440;
    local_430 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_460,"z-",&local_461);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_460);
    __l_12._M_len = local_430;
    __l_12._M_array = local_438;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_12);
    std::__cxx11::string::~string(local_460);
    std::allocator<char>::~allocator((allocator<char> *)&local_461);
    ClassPair::ClassPair(&local_480,2,4);
    local_478 = &local_480;
    local_470 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"z-",&local_4a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_4a0);
    __l_11._M_len = local_470;
    __l_11._M_array = local_478;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_11);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    ClassPair::ClassPair(&local_4c0,2,10);
    local_4b8 = &local_4c0;
    local_4b0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4e0,"y-",&local_4e1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_4e0);
    __l_10._M_len = local_4b0;
    __l_10._M_array = local_4b8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_10);
    std::__cxx11::string::~string(local_4e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    ClassPair::ClassPair(&local_500,2,10);
    local_4f8 = &local_500;
    local_4f0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_520,"y-",&local_521);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_520);
    __l_09._M_len = local_4f0;
    __l_09._M_array = local_4f8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_09);
    std::__cxx11::string::~string(local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    ClassPair::ClassPair(&local_540,2,0xc);
    local_538 = &local_540;
    local_530 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_560,"x-",&local_561);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_560);
    __l_08._M_len = local_530;
    __l_08._M_array = local_538;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_08);
    std::__cxx11::string::~string(local_560);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    ClassPair::ClassPair(&local_580,2,0xc);
    local_578 = &local_580;
    local_570 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5a0,"x-",&local_5a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_5a0);
    __l_07._M_len = local_570;
    __l_07._M_array = local_578;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_07);
    std::__cxx11::string::~string(local_5a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
    ClassPair::ClassPair(&local_5c0,3,0xd);
    local_5b8 = &local_5c0;
    local_5b0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e0,"body",&local_5e1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_5e0);
    __l_06._M_len = local_5b0;
    __l_06._M_array = local_5b8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_06);
    std::__cxx11::string::~string(local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    ClassPair::ClassPair(&local_600,3,0xd);
    local_5f8 = &local_600;
    local_5f0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_620,"body",&local_621);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_620);
    __l_05._M_len = local_5f0;
    __l_05._M_array = local_5f8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_05);
    std::__cxx11::string::~string(local_620);
    std::allocator<char>::~allocator((allocator<char> *)&local_621);
    ClassPair::ClassPair(&local_640,2,0xe);
    local_638 = &local_640;
    local_630 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_660,"x+",&local_661);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_660);
    __l_04._M_len = local_630;
    __l_04._M_array = local_638;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_04);
    std::__cxx11::string::~string(local_660);
    std::allocator<char>::~allocator((allocator<char> *)&local_661);
    ClassPair::ClassPair(&local_680,2,0xe);
    local_678 = &local_680;
    local_670 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6a0,"x+",&local_6a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_6a0);
    __l_03._M_len = local_670;
    __l_03._M_array = local_678;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_03);
    std::__cxx11::string::~string(local_6a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
    ClassPair::ClassPair(&local_6c0,2,0x10);
    local_6b8 = &local_6c0;
    local_6b0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6e0,"y+",&local_6e1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_6e0);
    __l_02._M_len = local_6b0;
    __l_02._M_array = local_6b8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_02);
    std::__cxx11::string::~string(local_6e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
    ClassPair::ClassPair(&local_700,2,0x10);
    local_6f8 = &local_700;
    local_6f0 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_720,"y+",&local_721);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_720);
    __l_01._M_len = local_6f0;
    __l_01._M_array = local_6f8;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_01);
    std::__cxx11::string::~string(local_720);
    std::allocator<char>::~allocator((allocator<char> *)&local_721);
    ClassPair::ClassPair(&local_740,2,0x16);
    local_738 = &local_740;
    local_730 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_760,"z+",&local_761);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_760);
    __l_00._M_len = local_730;
    __l_00._M_array = local_738;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l_00);
    std::__cxx11::string::~string(local_760);
    std::allocator<char>::~allocator((allocator<char> *)&local_761);
    ClassPair::ClassPair(&local_780,2,0x16);
    local_778 = &local_780;
    local_770 = 1;
    pvVar1 = std::
             array<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>,_3UL>
             ::operator[](__return_storage_ptr__,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7a0,"z+",&local_7a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
             ::operator[](pvVar1,(key_type *)local_7a0);
    __l._M_len = local_770;
    __l._M_array = local_778;
    std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>::operator=(pmVar2,__l);
    std::__cxx11::string::~string(local_7a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  }
  return __return_storage_ptr__;
}

Assistant:

Assoc get_box_assoc(int dim) {
  Assoc assoc;
  if (dim == 1) {
    assoc[NODE_SET]["x-"] = {{0, 0}};
    assoc[SIDE_SET]["x-"] = {{0, 0}};
    assoc[NODE_SET]["body"] = {{1, 1}};
    assoc[ELEM_SET]["body"] = {{1, 1}};
    assoc[NODE_SET]["x+"] = {{0, 2}};
    assoc[SIDE_SET]["x+"] = {{0, 2}};
  } else if (dim == 2) {
    assoc[NODE_SET]["y-"] = {{1, 1}};
    assoc[SIDE_SET]["y-"] = {{1, 1}};
    assoc[NODE_SET]["x-"] = {{1, 3}};
    assoc[SIDE_SET]["x-"] = {{1, 3}};
    assoc[NODE_SET]["body"] = {{2, 4}};
    assoc[ELEM_SET]["body"] = {{2, 4}};
    assoc[NODE_SET]["x+"] = {{1, 5}};
    assoc[SIDE_SET]["x+"] = {{1, 5}};
    assoc[NODE_SET]["y+"] = {{1, 7}};
    assoc[SIDE_SET]["y+"] = {{1, 7}};
  } else if (dim == 3) {
    assoc[NODE_SET]["z-"] = {{2, 4}};
    assoc[SIDE_SET]["z-"] = {{2, 4}};
    assoc[NODE_SET]["y-"] = {{2, 10}};
    assoc[SIDE_SET]["y-"] = {{2, 10}};
    assoc[NODE_SET]["x-"] = {{2, 12}};
    assoc[SIDE_SET]["x-"] = {{2, 12}};
    assoc[NODE_SET]["body"] = {{3, 13}};
    assoc[ELEM_SET]["body"] = {{3, 13}};
    assoc[NODE_SET]["x+"] = {{2, 14}};
    assoc[SIDE_SET]["x+"] = {{2, 14}};
    assoc[NODE_SET]["y+"] = {{2, 16}};
    assoc[SIDE_SET]["y+"] = {{2, 16}};
    assoc[NODE_SET]["z+"] = {{2, 22}};
    assoc[SIDE_SET]["z+"] = {{2, 22}};
  }
  return assoc;
}